

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectDrawSurface.cpp
# Opt level: O0

bool __thiscall nv::DirectDrawSurface::isValid(DirectDrawSurface *this)

{
  uint uVar1;
  uint required;
  DirectDrawSurface *this_local;
  
  uVar1 = (*this->stream->_vptr_Stream[6])();
  if ((uVar1 & 1) == 0) {
    if (((this->header).fourcc == 0x20534444) && ((this->header).size == 0x7c)) {
      if (((this->header).flags & 6) == 6) {
        if ((this->header).pf.size == 0x20) {
          if (((this->header).caps.caps1 & 0x1000) == 0) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DirectDrawSurface::isValid() const
{
	if (stream->isError())
	{
		return false;
	}
	
	if (header.fourcc != FOURCC_DDS || header.size != 124)
	{
		return false;
	}
	
	const uint required = (DDSD_WIDTH|DDSD_HEIGHT/*|DDSD_CAPS|DDSD_PIXELFORMAT*/);
	if( (header.flags & required) != required ) {
		return false;
	}
	
	if (header.pf.size != 32) {
		return false;
	}
	
	if( !(header.caps.caps1 & DDSCAPS_TEXTURE) ) {
		return false;
	}
	
	return true;
}